

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

DILogger * __thiscall
glcts::anon_unknown_0::DIResult::sub_result
          (DILogger *__return_storage_ptr__,DIResult *this,long _code)

{
  string local_1b0 [32];
  DILogger local_190;
  
  if (_code == 0) {
    DILogger::DILogger(&local_190);
    local_190.null_log_ = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&__return_storage_ptr__->str_);
    __return_storage_ptr__->null_log_ = local_190.null_log_;
    if (local_190.null_log_ == false) {
      std::__cxx11::stringbuf::str();
      std::operator<<(&(__return_storage_ptr__->str_).
                       super_basic_ostream<char,_std::char_traits<char>_>,local_1b0);
      std::__cxx11::string::~string(local_1b0);
    }
    DILogger::~DILogger(&local_190);
  }
  else {
    this->status_ = this->status_ | _code;
    DILogger::DILogger(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

DILogger sub_result(long _code)
	{
		if (_code == NO_ERROR)
		{
			return sub_result_inner(_code).nullify();
		}
		else
		{
			return sub_result_inner(_code);
		}
	}